

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O3

metric_name __thiscall fasttext::Args::getAutotuneMetric(Args *this)

{
  int iVar1;
  metric_name mVar2;
  runtime_error *this_00;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __rhs = &this->autotuneMetric;
  std::__cxx11::string::substr((ulong)&local_40,(ulong)__rhs);
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if (iVar1 == 0) {
    mVar2 = labelf1score;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)__rhs);
    mVar2 = f1score;
    if (iVar1 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"Unknown metric : ",__rhs);
      std::runtime_error::runtime_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return mVar2;
}

Assistant:

metric_name Args::getAutotuneMetric() const {
  if (autotuneMetric.substr(0, 3) == "f1:") {
    return metric_name::labelf1score;
  } else if (autotuneMetric == "f1") {
    return metric_name::f1score;
  }
  throw std::runtime_error("Unknown metric : " + autotuneMetric);
}